

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O1

REF_BOOL ref_dict_has_key(REF_DICT ref_dict,REF_INT key)

{
  long lVar1;
  
  if (0 < (long)ref_dict->n) {
    lVar1 = 0;
    do {
      if (ref_dict->key[lVar1] == key) {
        return 1;
      }
      lVar1 = lVar1 + 1;
    } while (ref_dict->n != lVar1);
  }
  return 0;
}

Assistant:

REF_FCN REF_BOOL ref_dict_has_key(REF_DICT ref_dict, REF_INT key) {
  REF_INT i;

  for (i = 0; i < ref_dict_n(ref_dict); i++)
    if (key == ref_dict->key[i]) {
      return REF_TRUE;
    }

  return REF_FALSE;
}